

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 10.cpp
# Opt level: O3

int main(void)

{
  size_t sVar1;
  long *plVar2;
  long lVar3;
  char *pcVar4;
  int x;
  char eme [8];
  int local_1c;
  char local_18 [8];
  
  builtin_strncpy(local_18,"\x1b[1;32m",8);
  sVar1 = strlen(local_18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_18,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Summum bonum ( \'sumo bem\' ou \'bem maior, em latim) eh uma expressao latina usada na filosofia - particularmente, em Aristoteles "
             ,0x80);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             ",na filosofia medieval e na filosofia de Immanuel Kant - para descrever o bem maior que o ser humano deve buscar."
             ,0x71);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Voce se considera sujeito ao \'Summum Bonum\'(digite 1 pra sim e 0 pra nao)?",0x4a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::istream::operator>>((istream *)&std::cin,&local_1c);
  if (local_1c == 1) {
    pcVar4 = "Parabens.Summum Bonum eh o maximo do bem que eh um fim em si.";
    lVar3 = 0x3d;
  }
  else {
    pcVar4 = "Nada mal. A natureza desse estado preocupou muitos autores, dentre eles cristaos.";
    lVar3 = 0x51;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  return 0;
}

Assistant:

int main()
{
    char eme[] = {0x1b, '[', '1', ';', '3', '2', 'm', 0};
    cout << eme;
    int x;
    cout << "Summum bonum ( 'sumo bem' ou 'bem maior, em latim) eh uma expressao latina usada na filosofia - particularmente, em Aristoteles ";
    cout << ",na filosofia medieval e na filosofia de Immanuel Kant - para descrever o bem maior que o ser humano deve buscar." << endl
         << endl;
    cout << "Voce se considera sujeito ao 'Summum Bonum'(digite 1 pra sim e 0 pra nao)?" << endl;
    cin >> x;

    if (x == true)
    {
        cout << "Parabens.Summum Bonum eh o maximo do bem que eh um fim em si.";
    }
    else
    {
        cout << "Nada mal. A natureza desse estado preocupou muitos autores, dentre eles cristaos.";
    }

    return 0;
}